

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_refs_push(MDD lddmc)

{
  MDD *pMVar1;
  lddmc_refs_internal_t lddmc_refs_key;
  MDD *pMVar2;
  long in_FS_OFFSET;
  
  while (lddmc_refs_key = *(lddmc_refs_internal_t *)(in_FS_OFFSET + -0x20),
        lddmc_refs_key == (lddmc_refs_internal_t)0x0) {
    lddmc_refs_init_key();
  }
  pMVar2 = lddmc_refs_key->rcur;
  pMVar1 = pMVar2 + 1;
  lddmc_refs_key->rcur = pMVar1;
  *pMVar2 = lddmc;
  if (pMVar1 == lddmc_refs_key->rend) {
    lddmc_refs_refs_up(lddmc_refs_key,lddmc);
  }
  return lddmc;
}

Assistant:

MDD __attribute__((unused))
lddmc_refs_push(MDD lddmc)
{
    LOCALIZE_THREAD_LOCAL(lddmc_refs_key, lddmc_refs_internal_t);
    if (lddmc_refs_key == 0) {
        lddmc_refs_init_key();
        return lddmc_refs_push(lddmc);
    } else {
        *(lddmc_refs_key->rcur++) = lddmc;
        if (lddmc_refs_key->rcur == lddmc_refs_key->rend) return lddmc_refs_refs_up(lddmc_refs_key, lddmc);
        else return lddmc;
    }
}